

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  short *psVar1;
  short sVar2;
  XMLCh XVar3;
  bool bVar4;
  int iVar5;
  DOMDocument *pDVar6;
  long *plVar7;
  wchar16 *pwVar8;
  long lVar9;
  XMLCh *pXVar10;
  undefined2 *puVar11;
  ulong uVar12;
  ulong uVar13;
  short sVar14;
  XMLCh XVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  XMLBuffer elData;
  XMLBuffer rawUData;
  char cFileName [4000];
  XMLCh tempStr_1 [4000];
  XMLCh tempStr [4000];
  ulong local_4f10;
  ulong local_4f08;
  undefined8 local_4f00;
  undefined1 local_4ef8;
  MemoryManager *local_4ef0;
  undefined8 local_4ee8;
  undefined2 *local_4ee0;
  XMLBuffer local_4ed8;
  XMLBuffer local_4ea0;
  long local_4e68;
  long *local_4e60;
  char local_4e58 [4000];
  wchar16 local_3eb8 [4000];
  wchar16 local_1f78 [4004];
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (argc == 2) {
    pDVar6 = parseFile(argv[1]);
    if (pDVar6 != (DOMDocument *)0x0) {
      xercesc_4_0::XMLString::transcode
                ("testFile",local_1f78,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_4e60 = (long *)(**(code **)(*(long *)pDVar6 + 0x70))(pDVar6);
      local_4e68 = (**(code **)(*local_4e60 + 0x18))();
      if (local_4e68 != 0) {
        lVar16 = 0;
        do {
          gTestsRun = gTestsRun + 1;
          plVar7 = (long *)(**(code **)(*local_4e60 + 0x10))();
          xercesc_4_0::XMLString::transcode
                    ("name",local_1f78,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x148))(plVar7,local_1f78);
          xercesc_4_0::XMLString::transcode
                    (pwVar8,local_4e58,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          pDVar6 = parseFile(local_4e58);
          if (pDVar6 == (DOMDocument *)0x0) {
LAB_00102b91:
            gTestsFailed = gTestsFailed + 1;
          }
          else {
            xercesc_4_0::XMLString::transcode
                      ("data",local_3eb8,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x70))(pDVar6,local_3eb8);
            lVar9 = (**(code **)(*plVar7 + 0x18))(plVar7);
            if (lVar9 != 1) {
              fprintf(_stderr,"Test file \"%s\" must have exactly one \"data\" element.\n",
                      local_4e58);
              goto LAB_00102b91;
            }
            plVar7 = (long *)(**(code **)(*plVar7 + 0x10))(plVar7,0);
            local_4ed8.fIndex = 0;
            local_4ed8.fCapacity = 0x3ff;
            local_4ed8.fFullSize = 0;
            local_4ed8.fUsed = false;
            local_4ed8.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
            local_4ed8.fFullHandler = (XMLBufferFullHandler *)0x0;
            local_4ed8.fBuffer = (XMLCh *)0x0;
            local_4ed8.fBuffer =
                 (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager +
                                      0x18))(xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800);
            *local_4ed8.fBuffer = L'\0';
            for (plVar7 = (long *)(**(code **)(*plVar7 + 0x38))(plVar7); plVar7 != (long *)0x0;
                plVar7 = (long *)(**(code **)(*plVar7 + 0x50))(plVar7)) {
              iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7);
              if (iVar5 != 8) {
                iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7);
                if (((iVar5 != 3) && (iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar5 != 4)) &&
                   (iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar5 != 5)) {
                  pcVar17 = "Test file \"%s\": data element contains unexpected children.";
                  goto LAB_00102bc0;
                }
                pXVar10 = (XMLCh *)(**(code **)(*plVar7 + 0x140))(plVar7);
                xercesc_4_0::XMLBuffer::append(&local_4ed8,pXVar10);
              }
            }
            xercesc_4_0::XMLString::transcode
                      ("udata",local_3eb8,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            plVar7 = (long *)(**(code **)(*(long *)pDVar6 + 0x70))(pDVar6,local_3eb8);
            lVar9 = (**(code **)(*plVar7 + 0x18))(plVar7);
            if (lVar9 == 1) {
              plVar7 = (long *)(**(code **)(*plVar7 + 0x10))(plVar7,0);
              local_4ea0.fIndex = 0;
              local_4ea0.fCapacity = 0x3ff;
              local_4ea0.fFullSize = 0;
              local_4ea0.fUsed = false;
              local_4ea0.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
              local_4ea0.fFullHandler = (XMLBufferFullHandler *)0x0;
              local_4ea0.fBuffer = (XMLCh *)0x0;
              local_4ea0.fBuffer =
                   (XMLCh *)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager +
                                        0x18))(xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0x800)
              ;
              *local_4ea0.fBuffer = L'\0';
              for (plVar7 = (long *)(**(code **)(*plVar7 + 0x38))(plVar7); plVar7 != (long *)0x0;
                  plVar7 = (long *)(**(code **)(*plVar7 + 0x50))(plVar7)) {
                iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7);
                if (iVar5 != 8) {
                  iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7);
                  if (((iVar5 != 3) && (iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar5 != 4))
                     && (iVar5 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar5 != 5)) {
                    bVar4 = false;
                    fprintf(_stderr,"Test file \"%s\": udata element contains unexpected children.",
                            local_4e58);
                    goto LAB_00102b36;
                  }
                  pXVar10 = (XMLCh *)(**(code **)(*plVar7 + 0x140))(plVar7);
                  xercesc_4_0::XMLBuffer::append(&local_4ea0,pXVar10);
                }
              }
              local_4f10 = 0;
              local_4f08 = 0x3ff;
              local_4f00 = 0;
              local_4ef8 = 0;
              local_4ef0 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
              local_4ee8 = 0;
              puVar11 = (undefined2 *)
                        (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18)
                        )();
              *puVar11 = 0;
              local_4ee0 = puVar11;
              if (local_4ea0.fIndex != 0) {
                uVar13 = 0;
                uVar12 = local_4ea0.fIndex;
                do {
                  local_4ea0.fBuffer[uVar12] = L'\0';
                  lVar9 = 0;
                  do {
                    psVar1 = (short *)((long)local_4ea0.fBuffer + lVar9);
                    lVar9 = lVar9 + 2;
                  } while (*psVar1 != 0);
                  while (((uVar13 < (lVar9 >> 1) - 1U &&
                          ((ulong)(ushort)local_4ea0.fBuffer[uVar13] < 0x21)) &&
                         ((0x100000600U >> ((ulong)(ushort)local_4ea0.fBuffer[uVar13] & 0x3f) & 1)
                          != 0))) {
                    uVar13 = (ulong)((int)uVar13 + 1);
                  }
                  lVar9 = 0;
                  do {
                    psVar1 = (short *)((long)local_4ea0.fBuffer + lVar9);
                    lVar9 = lVar9 + 2;
                  } while (*psVar1 != 0);
                  uVar18 = (lVar9 >> 1) - 1;
                  if (uVar13 < uVar18) {
                    sVar14 = 0;
                    do {
                      XVar3 = local_4ea0.fBuffer[uVar13];
                      XVar15 = XVar3 + L'￠';
                      if (5 < (ushort)(XVar3 + L'ﾟ')) {
                        XVar15 = XVar3;
                      }
                      if (((ushort)(XVar15 + L'ﾹ') < 0xffe9) || ((ushort)(XVar15 + L'ￆ') < 7))
                      break;
                      sVar2 = sVar14 * 0x10 + -0x37;
                      if ((ushort)XVar15 < 0x3a) {
                        sVar2 = sVar14 * 0x10 + -0x30;
                      }
                      sVar14 = sVar2 + XVar15;
                      uVar13 = (ulong)((int)uVar13 + 1);
                    } while (uVar13 < uVar18);
                    if (sVar14 == 0) goto LAB_00102ac8;
                    if (local_4f10 == local_4f08) {
                      xercesc_4_0::XMLBuffer::ensureCapacity((ulong)&local_4f10);
                      puVar11 = local_4ee0;
                      uVar12 = local_4ea0.fIndex;
                    }
                    puVar11[local_4f10] = sVar14;
                    local_4f10 = local_4f10 + 1;
                  }
                  else {
LAB_00102ac8:
                    if (uVar13 < uVar12) {
                      bVar4 = false;
                      fprintf(_stderr,
                              "Test file \"%s\": Bad hex number in udata element.  Data character number %llu\n"
                              ,local_4e58,local_4f10);
                      goto LAB_00102b26;
                    }
                  }
                } while (uVar13 < uVar12);
              }
              pXVar10 = local_4ed8.fBuffer;
              uVar13 = 0;
              if (local_4ed8.fIndex != 0) {
                do {
                  local_4ed8.fBuffer[local_4ed8.fIndex] = L'\0';
                  puVar11[local_4f10] = 0;
                  if (local_4f10 <= uVar13) {
                    pcVar17 = 
                    "Test file \"%s\": udata element shorter than data at char number %d\n";
LAB_00102c30:
                    fprintf(_stderr,pcVar17,local_4e58);
                    goto LAB_00102c42;
                  }
                  if (puVar11[uVar13] != local_4ed8.fBuffer[uVar13]) {
                    pcVar17 = "Test file \"%s\": comparison failure at character number %d\n";
                    goto LAB_00102c30;
                  }
                  uVar13 = (ulong)((int)uVar13 + 1);
                } while (uVar13 < local_4ed8.fIndex);
              }
              bVar4 = true;
              if (local_4ed8.fIndex != local_4f10) {
                fprintf(_stderr,
                        "Test file \"%s\": udata element longer than data at char number %d\n",
                        local_4e58);
                local_4ed8.fBuffer[local_4ed8.fIndex] = L'\0';
                pXVar10 = local_4ed8.fBuffer;
LAB_00102c42:
                bVar4 = false;
                writeUData(pXVar10);
              }
LAB_00102b26:
              (**(code **)(*(long *)local_4ef0 + 0x20))(local_4ef0,local_4ee0);
LAB_00102b36:
              (**(code **)(*(long *)local_4ea0.fMemoryManager + 0x20))
                        (local_4ea0.fMemoryManager,local_4ea0.fBuffer);
            }
            else {
              pcVar17 = "Test file \"%s\" must have exactly one \"udata\" element.\n";
LAB_00102bc0:
              bVar4 = false;
              fprintf(_stderr,pcVar17,local_4e58);
            }
            (**(code **)(*(long *)local_4ed8.fMemoryManager + 0x20))
                      (local_4ed8.fMemoryManager,local_4ed8.fBuffer);
            if (!bVar4) goto LAB_00102b91;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != local_4e68);
      }
      printf("Encoding Tests Results Summary: \n   %d encoding tests run.\n   %d tests passed,\n   %d tests failed\n"
             ,(ulong)(uint)gTestsRun,(ulong)(uint)(gTestsRun - gTestsFailed));
      if (parser != (XercesDOMParser *)0x0) {
        (**(code **)(*(long *)parser + 8))();
      }
      parser = (XercesDOMParser *)0x0;
      return 0;
    }
  }
  else {
    printf("usage: %s file_name \n   where file name is the xml file specifying the list of test files."
           ,*argv);
  }
  return 1;
}

Assistant:

int main(int argc, char ** argv) {

   //
    // Initialize the Xerces-c environment
    //
	try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        fprintf(stderr, "Error during initialization of xerces-c: %s\n",
            XMLString::transcode(toCatch.getMessage()));
         return 1;
    }

    //
    // Parse the command line, which should specify exactly one file, which is an
    //   xml file containing the list of test files to be processed.
    //
    if (argc != 2) {
        printf("usage: %s file_name \n"
               "   where file name is the xml file specifying the list of test files.", argv[0]);
        return 1;
    }
    DOMDocument* fileListDoc = parseFile(argv[1]);
    if (fileListDoc == 0) return 1;


    //
    // Iterate over the list of files, running each as a test.
    //
    XMLCh tempStr[4000];
    XMLString::transcode("testFile", tempStr, 3999);
    DOMNodeList* list = fileListDoc->getElementsByTagName(tempStr);
    XMLSize_t i;
    XMLSize_t numFiles = list->getLength();
    for (i=0; i<numFiles; i++)
    {
        ++gTestsRun;
        DOMNode* tmpNode3 = list->item(i);
        XMLString::transcode("name", tempStr, 3999);
        const XMLCh* fileName = ((DOMElement*) tmpNode3)->getAttribute(tempStr);
        if (processTestFile(fileName) == false)
            ++gTestsFailed;
    };



    //
    // We are done.  Print out a summary of the results
    //
    printf("Encoding Tests Results Summary: \n"
           "   %d encoding tests run.\n"
           "   %d tests passed,\n"
           "   %d tests failed\n", gTestsRun, gTestsRun-gTestsFailed, gTestsFailed);

    delete parser;
    parser = 0;
   return 0;
}